

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

long __thiscall
duckdb::DecimalScaleDownOperator::Operation<duckdb::hugeint_t,long>
          (DecimalScaleDownOperator *this,hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr
          )

{
  bool bVar1;
  InvalidInputException *this_00;
  int64_t iVar2;
  hugeint_t input_00;
  hugeint_t input_01;
  long result;
  hugeint_t scaling;
  hugeint_t local_78;
  long local_68;
  string local_60;
  hugeint_t local_40;
  hugeint_t local_30;
  
  local_78.upper = input.lower;
  local_78.lower = (uint64_t)this;
  hugeint_t::hugeint_t((hugeint_t *)&local_60,2);
  local_30 = hugeint_t::operator/((hugeint_t *)(idx + 0x30),(hugeint_t *)&local_60);
  hugeint_t::operator/=(&local_78,&local_30);
  hugeint_t::hugeint_t((hugeint_t *)&local_60,0);
  bVar1 = hugeint_t::operator<(&local_78,(hugeint_t *)&local_60);
  if (bVar1) {
    hugeint_t::hugeint_t((hugeint_t *)&local_60,1);
    hugeint_t::operator-=(&local_78,(hugeint_t *)&local_60);
  }
  else {
    hugeint_t::hugeint_t((hugeint_t *)&local_60,1);
    hugeint_t::operator+=(&local_78,(hugeint_t *)&local_60);
  }
  hugeint_t::hugeint_t(&local_40,2);
  input_00 = hugeint_t::operator/(&local_78,&local_40);
  input_01.lower = input_00.upper;
  iVar2 = 0;
  bVar1 = TryCast::Operation<duckdb::hugeint_t,long>(input_00,&local_68,false);
  if (bVar1) {
    return local_68;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_01.upper = iVar2;
  CastExceptionText<duckdb::hugeint_t,long>(&local_60,(duckdb *)input_00.lower,input_01);
  InvalidInputException::InvalidInputException(this_00,&local_60);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		//	We need to round here, not truncate.
		auto data = (DecimalScaleInput<INPUT_TYPE> *)dataptr;
		//	Scale first so we don't overflow when rounding.
		const auto scaling = data->factor / 2;
		input /= scaling;
		if (input < 0) {
			input -= 1;
		} else {
			input += 1;
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input / 2);
	}